

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

bool mkvparser::MasteringMetadata::Parse
               (IMkvReader *reader,longlong mm_start,longlong mm_size,MasteringMetadata **mm)

{
  unique_ptr<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_> uVar1
  ;
  longlong lVar2;
  longlong lVar3;
  long lVar4;
  bool bVar5;
  _Head_base<0UL,_mkvparser::MasteringMetadata_*,_false> chromaticity;
  long stop;
  bool bVar6;
  float fVar7;
  unique_ptr<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>
  mm_ptr;
  double value;
  longlong read_pos;
  longlong child_size;
  longlong child_id;
  __uniq_ptr_data<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>,_true,_true>
  *local_38;
  
  if ((reader == (IMkvReader *)0x0) || (*mm != (MasteringMetadata *)0x0)) {
    bVar5 = false;
  }
  else {
    local_38 = (__uniq_ptr_data<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>,_true,_true>
                *)mm;
    mm_ptr._M_t.
    super___uniq_ptr_impl<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>
    ._M_t.
    super__Tuple_impl<0UL,_mkvparser::MasteringMetadata_*,_std::default_delete<mkvparser::MasteringMetadata>_>
    .super__Head_base<0UL,_mkvparser::MasteringMetadata_*,_false>._M_head_impl =
         (__uniq_ptr_data<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>,_true,_true>
          )operator_new(0x28);
    *(undefined8 *)
     mm_ptr._M_t.
     super___uniq_ptr_impl<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>
     ._M_t.
     super__Tuple_impl<0UL,_mkvparser::MasteringMetadata_*,_std::default_delete<mkvparser::MasteringMetadata>_>
     .super__Head_base<0UL,_mkvparser::MasteringMetadata_*,_false>._M_head_impl = 0;
    *(undefined8 *)
     ((long)mm_ptr._M_t.
            super___uniq_ptr_impl<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>
            ._M_t.
            super__Tuple_impl<0UL,_mkvparser::MasteringMetadata_*,_std::default_delete<mkvparser::MasteringMetadata>_>
            .super__Head_base<0UL,_mkvparser::MasteringMetadata_*,_false>._M_head_impl + 8) = 0;
    *(undefined8 *)
     ((long)mm_ptr._M_t.
            super___uniq_ptr_impl<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>
            ._M_t.
            super__Tuple_impl<0UL,_mkvparser::MasteringMetadata_*,_std::default_delete<mkvparser::MasteringMetadata>_>
            .super__Head_base<0UL,_mkvparser::MasteringMetadata_*,_false>._M_head_impl + 0x10) = 0;
    *(undefined8 *)
     ((long)mm_ptr._M_t.
            super___uniq_ptr_impl<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>
            ._M_t.
            super__Tuple_impl<0UL,_mkvparser::MasteringMetadata_*,_std::default_delete<mkvparser::MasteringMetadata>_>
            .super__Head_base<0UL,_mkvparser::MasteringMetadata_*,_false>._M_head_impl + 0x18) = 0;
    *(undefined8 *)
     ((long)mm_ptr._M_t.
            super___uniq_ptr_impl<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>
            ._M_t.
            super__Tuple_impl<0UL,_mkvparser::MasteringMetadata_*,_std::default_delete<mkvparser::MasteringMetadata>_>
            .super__Head_base<0UL,_mkvparser::MasteringMetadata_*,_false>._M_head_impl + 0x20) =
         0x7f7fffff7f7fffff;
    stop = mm_size + mm_start;
    read_pos = mm_start;
    while (uVar1._M_t.
           super___uniq_ptr_impl<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>
           ._M_t.
           super__Tuple_impl<0UL,_mkvparser::MasteringMetadata_*,_std::default_delete<mkvparser::MasteringMetadata>_>
           .super__Head_base<0UL,_mkvparser::MasteringMetadata_*,_false>._M_head_impl =
                mm_ptr._M_t.
                super___uniq_ptr_impl<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>
                ._M_t.
                super__Tuple_impl<0UL,_mkvparser::MasteringMetadata_*,_std::default_delete<mkvparser::MasteringMetadata>_>
                .super__Head_base<0UL,_mkvparser::MasteringMetadata_*,_false>._M_head_impl,
          bVar5 = stop <= read_pos, read_pos < stop) {
      child_id = 0;
      child_size = 0;
      lVar4 = ParseElementHeader(reader,&read_pos,stop,&child_id,&child_size);
      lVar3 = child_size;
      lVar2 = read_pos;
      if (lVar4 < 0) goto switchD_00763635_default;
      switch(child_id) {
      case 0x55d1:
      case 0x55d2:
        bVar6 = child_id == 0x55d1;
        chromaticity._M_head_impl = (MasteringMetadata *)mm_ptr;
        break;
      case 0x55d3:
      case 0x55d4:
        bVar6 = child_id == 0x55d3;
        chromaticity._M_head_impl =
             (MasteringMetadata *)
             ((long)mm_ptr._M_t.
                    super___uniq_ptr_impl<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_mkvparser::MasteringMetadata_*,_std::default_delete<mkvparser::MasteringMetadata>_>
                    .super__Head_base<0UL,_mkvparser::MasteringMetadata_*,_false>._M_head_impl + 8);
        break;
      case 0x55d5:
      case 0x55d6:
        bVar6 = child_id == 0x55d5;
        chromaticity._M_head_impl =
             (MasteringMetadata *)
             ((long)mm_ptr._M_t.
                    super___uniq_ptr_impl<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_mkvparser::MasteringMetadata_*,_std::default_delete<mkvparser::MasteringMetadata>_>
                    .super__Head_base<0UL,_mkvparser::MasteringMetadata_*,_false>._M_head_impl +
             0x10);
        break;
      case 0x55d7:
      case 0x55d8:
        bVar6 = child_id == 0x55d7;
        chromaticity._M_head_impl =
             (MasteringMetadata *)
             ((long)mm_ptr._M_t.
                    super___uniq_ptr_impl<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_mkvparser::MasteringMetadata_*,_std::default_delete<mkvparser::MasteringMetadata>_>
                    .super__Head_base<0UL,_mkvparser::MasteringMetadata_*,_false>._M_head_impl +
             0x18);
        break;
      case 0x55d9:
        value = 0.0;
        lVar4 = UnserializeFloat(reader,read_pos,child_size,&value);
        if ((ABS(value) <= 3.4028234663852886e+38) &&
           ((value <= 0.0 || (1.1754943508222875e-38 <= value)))) {
          fVar7 = (float)value;
          *(float *)((long)mm_ptr._M_t.
                           super___uniq_ptr_impl<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_mkvparser::MasteringMetadata_*,_std::default_delete<mkvparser::MasteringMetadata>_>
                           .super__Head_base<0UL,_mkvparser::MasteringMetadata_*,_false>.
                           _M_head_impl + 0x20) = fVar7;
          if ((-1 < lVar4) && ((0.0 <= fVar7 && (fVar7 <= 9999.99)))) goto LAB_007636a4;
        }
        goto switchD_00763635_default;
      case 0x55da:
        value = 0.0;
        lVar4 = UnserializeFloat(reader,read_pos,child_size,&value);
        if ((ABS(value) <= 3.4028234663852886e+38) &&
           ((value <= 0.0 || (1.1754943508222875e-38 <= value)))) {
          fVar7 = (float)value;
          *(float *)((long)mm_ptr._M_t.
                           super___uniq_ptr_impl<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_mkvparser::MasteringMetadata_*,_std::default_delete<mkvparser::MasteringMetadata>_>
                           .super__Head_base<0UL,_mkvparser::MasteringMetadata_*,_false>.
                           _M_head_impl + 0x24) = fVar7;
          if ((-1 < lVar4) && ((0.0 <= fVar7 && (fVar7 <= 999.9999)))) goto LAB_007636a4;
        }
      default:
        goto switchD_00763635_default;
      }
      bVar6 = PrimaryChromaticity::Parse
                        (reader,read_pos,child_size,bVar6,&(chromaticity._M_head_impl)->r);
      if (!bVar6) goto switchD_00763635_default;
LAB_007636a4:
      read_pos = lVar2 + lVar3;
      if (stop < read_pos) goto switchD_00763635_default;
    }
    mm_ptr._M_t.
    super___uniq_ptr_impl<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>
    ._M_t.
    super__Tuple_impl<0UL,_mkvparser::MasteringMetadata_*,_std::default_delete<mkvparser::MasteringMetadata>_>
    .super__Head_base<0UL,_mkvparser::MasteringMetadata_*,_false>._M_head_impl =
         (__uniq_ptr_data<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>,_true,_true>
          )(__uniq_ptr_impl<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>
            )0x0;
    local_38->
    super___uniq_ptr_impl<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>
         = (__uniq_ptr_impl<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>
            )uVar1._M_t.
             super___uniq_ptr_impl<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>
             ._M_t.
             super__Tuple_impl<0UL,_mkvparser::MasteringMetadata_*,_std::default_delete<mkvparser::MasteringMetadata>_>
             .super__Head_base<0UL,_mkvparser::MasteringMetadata_*,_false>._M_head_impl;
switchD_00763635_default:
    std::
    unique_ptr<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>::
    ~unique_ptr(&mm_ptr);
  }
  return bVar5;
}

Assistant:

bool MasteringMetadata::Parse(IMkvReader* reader, long long mm_start,
                              long long mm_size, MasteringMetadata** mm) {
  if (!reader || *mm)
    return false;

  std::unique_ptr<MasteringMetadata> mm_ptr(new MasteringMetadata());
  if (!mm_ptr.get())
    return false;

  const long long mm_end = mm_start + mm_size;
  long long read_pos = mm_start;

  while (read_pos < mm_end) {
    long long child_id = 0;
    long long child_size = 0;

    const long long status =
        ParseElementHeader(reader, read_pos, mm_end, child_id, child_size);
    if (status < 0)
      return false;

    if (child_id == libwebm::kMkvLuminanceMax) {
      double value = 0;
      const long long value_parse_status =
          UnserializeFloat(reader, read_pos, child_size, value);
      if (value < -FLT_MAX || value > FLT_MAX ||
          (value > 0.0 && value < FLT_MIN)) {
        return false;
      }
      mm_ptr->luminance_max = static_cast<float>(value);
      if (value_parse_status < 0 || mm_ptr->luminance_max < 0.0 ||
          mm_ptr->luminance_max > 9999.99) {
        return false;
      }
    } else if (child_id == libwebm::kMkvLuminanceMin) {
      double value = 0;
      const long long value_parse_status =
          UnserializeFloat(reader, read_pos, child_size, value);
      if (value < -FLT_MAX || value > FLT_MAX ||
          (value > 0.0 && value < FLT_MIN)) {
        return false;
      }
      mm_ptr->luminance_min = static_cast<float>(value);
      if (value_parse_status < 0 || mm_ptr->luminance_min < 0.0 ||
          mm_ptr->luminance_min > 999.9999) {
        return false;
      }
    } else {
      bool is_x = false;
      PrimaryChromaticity** chromaticity;
      switch (child_id) {
        case libwebm::kMkvPrimaryRChromaticityX:
        case libwebm::kMkvPrimaryRChromaticityY:
          is_x = child_id == libwebm::kMkvPrimaryRChromaticityX;
          chromaticity = &mm_ptr->r;
          break;
        case libwebm::kMkvPrimaryGChromaticityX:
        case libwebm::kMkvPrimaryGChromaticityY:
          is_x = child_id == libwebm::kMkvPrimaryGChromaticityX;
          chromaticity = &mm_ptr->g;
          break;
        case libwebm::kMkvPrimaryBChromaticityX:
        case libwebm::kMkvPrimaryBChromaticityY:
          is_x = child_id == libwebm::kMkvPrimaryBChromaticityX;
          chromaticity = &mm_ptr->b;
          break;
        case libwebm::kMkvWhitePointChromaticityX:
        case libwebm::kMkvWhitePointChromaticityY:
          is_x = child_id == libwebm::kMkvWhitePointChromaticityX;
          chromaticity = &mm_ptr->white_point;
          break;
        default:
          return false;
      }
      const bool value_parse_status = PrimaryChromaticity::Parse(
          reader, read_pos, child_size, is_x, chromaticity);
      if (!value_parse_status)
        return false;
    }

    read_pos += child_size;
    if (read_pos > mm_end)
      return false;
  }

  *mm = mm_ptr.release();
  return true;
}